

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O3

void jpeg_make_d_derived_tbl(j_decompress_ptr cinfo,boolean isDC,int tblno,d_derived_tbl **pdtbl)

{
  jpeg_error_mgr *pjVar1;
  JHUFF_TBL *pJVar2;
  uint uVar3;
  d_derived_tbl *pdVar4;
  byte bVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  bool bVar14;
  char huffsize [257];
  uint huffcode [257];
  byte local_548 [268];
  uint auStack_43c [259];
  
  if (3 < (uint)tblno) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x32;
    (pjVar1->msg_parm).i[0] = tblno;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  pJVar2 = cinfo->dc_huff_tbl_ptrs[(ulong)(isDC == 0) * 4 + (long)tblno];
  if (pJVar2 == (JHUFF_TBL *)0x0) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x32;
    (pjVar1->msg_parm).i[0] = tblno;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  pdVar4 = *pdtbl;
  if (pdVar4 == (d_derived_tbl *)0x0) {
    pdVar4 = (d_derived_tbl *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x528);
    *pdtbl = pdVar4;
  }
  pdVar4->pub = pJVar2;
  uVar10 = 0;
  lVar13 = 1;
  do {
    bVar5 = pJVar2->bits[lVar13];
    if (0x100 < (int)(uVar10 + bVar5)) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 8;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
    }
    if (bVar5 != 0) {
      memset(local_548 + (int)uVar10,(int)lVar13,(ulong)bVar5);
      uVar10 = uVar10 + bVar5;
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x11);
  local_548[(int)uVar10] = 0;
  uVar12 = (uint)(char)local_548[0];
  if (local_548[0] != 0) {
    iVar8 = 0;
    uVar7 = 0;
    uVar3 = uVar12;
    do {
      if (uVar12 == (int)(char)uVar3) {
        lVar13 = 0;
        do {
          auStack_43c[(long)iVar8 + lVar13 + 1] = uVar7 + (int)lVar13;
          lVar6 = lVar13 + iVar8;
          lVar13 = lVar13 + 1;
        } while (uVar12 == (int)(char)local_548[lVar6 + 1]);
        iVar8 = iVar8 + (int)lVar13;
        uVar7 = uVar7 + (int)lVar13;
      }
      if (1L << ((byte)uVar12 & 0x3f) <= (long)(ulong)uVar7) {
        pjVar1 = cinfo->err;
        pjVar1->msg_code = 8;
        (*pjVar1->error_exit)((j_common_ptr)cinfo);
      }
      uVar7 = uVar7 * 2;
      uVar12 = uVar12 + 1;
      uVar3 = (uint)local_548[iVar8];
    } while (local_548[iVar8] != 0);
  }
  lVar13 = 0;
  lVar6 = 0;
  do {
    if (pJVar2->bits[lVar13 + 1] == '\0') {
      uVar11 = 0xffffffffffffffff;
    }
    else {
      lVar6 = (long)(int)lVar6;
      pdVar4->valoffset[lVar13 + 1] = lVar6 - (ulong)auStack_43c[lVar6 + 1];
      lVar6 = (ulong)pJVar2->bits[lVar13 + 1] + lVar6;
      uVar11 = (ulong)auStack_43c[lVar6];
    }
    pdVar4->maxcode[lVar13 + 1] = uVar11;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x10);
  pdVar4->valoffset[0x11] = 0;
  pdVar4->maxcode[0x11] = 0xfffff;
  lVar13 = 0;
  do {
    piVar9 = pdVar4->lookup + lVar13;
    piVar9[0] = 0x900;
    piVar9[1] = 0x900;
    piVar9[2] = 0x900;
    piVar9[3] = 0x900;
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0x100);
  lVar13 = 0;
  lVar6 = 1;
  do {
    if (pJVar2->bits[lVar6] != '\0') {
      bVar5 = 8 - (char)lVar6;
      lVar13 = (long)(int)lVar13;
      uVar12 = 1;
      do {
        piVar9 = pdVar4->lookup + (int)(auStack_43c[lVar13 + 1] << (bVar5 & 0x1f));
        iVar8 = (1 << (bVar5 & 0x1f)) + 1;
        do {
          *piVar9 = (uint)pJVar2->huffval[lVar13] | (int)lVar6 << 8;
          piVar9 = piVar9 + 1;
          iVar8 = iVar8 + -1;
        } while (1 < iVar8);
        lVar13 = lVar13 + 1;
        bVar14 = uVar12 < pJVar2->bits[lVar6];
        uVar12 = uVar12 + 1;
      } while (bVar14);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 9);
  if ((isDC != 0) && (0 < (int)uVar10)) {
    uVar11 = 0;
    do {
      if (0xf < pJVar2->huffval[uVar11]) {
        pjVar1 = cinfo->err;
        pjVar1->msg_code = 8;
        (*pjVar1->error_exit)((j_common_ptr)cinfo);
      }
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_make_d_derived_tbl(j_decompress_ptr cinfo, boolean isDC, int tblno,
                        d_derived_tbl **pdtbl)
{
  JHUFF_TBL *htbl;
  d_derived_tbl *dtbl;
  int p, i, l, si, numsymbols;
  int lookbits, ctr;
  char huffsize[257];
  unsigned int huffcode[257];
  unsigned int code;

  /* Note that huffsize[] and huffcode[] are filled in code-length order,
   * paralleling the order of the symbols themselves in htbl->huffval[].
   */

  /* Find the input Huffman table */
  if (tblno < 0 || tblno >= NUM_HUFF_TBLS)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);
  htbl =
    isDC ? cinfo->dc_huff_tbl_ptrs[tblno] : cinfo->ac_huff_tbl_ptrs[tblno];
  if (htbl == NULL)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);

  /* Allocate a workspace if we haven't already done so. */
  if (*pdtbl == NULL)
    *pdtbl = (d_derived_tbl *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  sizeof(d_derived_tbl));
  dtbl = *pdtbl;
  dtbl->pub = htbl;             /* fill in back link */

  /* Figure C.1: make table of Huffman code length for each symbol */

  p = 0;
  for (l = 1; l <= 16; l++) {
    i = (int)htbl->bits[l];
    if (i < 0 || p + i > 256)   /* protect against table overrun */
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    while (i--)
      huffsize[p++] = (char)l;
  }
  huffsize[p] = 0;
  numsymbols = p;

  /* Figure C.2: generate the codes themselves */
  /* We also validate that the counts represent a legal Huffman code tree. */

  code = 0;
  si = huffsize[0];
  p = 0;
  while (huffsize[p]) {
    while (((int)huffsize[p]) == si) {
      huffcode[p++] = code;
      code++;
    }
    /* code is now 1 more than the last code used for codelength si; but
     * it must still fit in si bits, since no code is allowed to be all ones.
     */
    if (((JLONG)code) >= (((JLONG)1) << si))
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    code <<= 1;
    si++;
  }

  /* Figure F.15: generate decoding tables for bit-sequential decoding */

  p = 0;
  for (l = 1; l <= 16; l++) {
    if (htbl->bits[l]) {
      /* valoffset[l] = huffval[] index of 1st symbol of code length l,
       * minus the minimum code of length l
       */
      dtbl->valoffset[l] = (JLONG)p - (JLONG)huffcode[p];
      p += htbl->bits[l];
      dtbl->maxcode[l] = huffcode[p - 1]; /* maximum code of length l */
    } else {
      dtbl->maxcode[l] = -1;    /* -1 if no codes of this length */
    }
  }
  dtbl->valoffset[17] = 0;
  dtbl->maxcode[17] = 0xFFFFFL; /* ensures jpeg_huff_decode terminates */

  /* Compute lookahead tables to speed up decoding.
   * First we set all the table entries to 0, indicating "too long";
   * then we iterate through the Huffman codes that are short enough and
   * fill in all the entries that correspond to bit sequences starting
   * with that code.
   */

  for (i = 0; i < (1 << HUFF_LOOKAHEAD); i++)
    dtbl->lookup[i] = (HUFF_LOOKAHEAD + 1) << HUFF_LOOKAHEAD;

  p = 0;
  for (l = 1; l <= HUFF_LOOKAHEAD; l++) {
    for (i = 1; i <= (int)htbl->bits[l]; i++, p++) {
      /* l = current code's length, p = its index in huffcode[] & huffval[]. */
      /* Generate left-justified code followed by all possible bit sequences */
      lookbits = huffcode[p] << (HUFF_LOOKAHEAD - l);
      for (ctr = 1 << (HUFF_LOOKAHEAD - l); ctr > 0; ctr--) {
        dtbl->lookup[lookbits] = (l << HUFF_LOOKAHEAD) | htbl->huffval[p];
        lookbits++;
      }
    }
  }

  /* Validate symbols as being reasonable.
   * For AC tables, we make no check, but accept all byte values 0..255.
   * For DC tables, we require the symbols to be in range 0..15.
   * (Tighter bounds could be applied depending on the data depth and mode,
   * but this is sufficient to ensure safe decoding.)
   */
  if (isDC) {
    for (i = 0; i < numsymbols; i++) {
      int sym = htbl->huffval[i];
      if (sym < 0 || sym > 15)
        ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    }
  }
}